

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip.h
# Opt level: O0

int bip_request_write(uint32_t *off,uint32_t *size,bip *buffer)

{
  uint uVar1;
  uint local_58;
  uint local_54;
  uint local_50;
  uint32_t available;
  uint32_t write;
  char full_r2;
  uint32_t write_;
  uint32_t read;
  uint32_t to_write;
  bip *buffer_local;
  uint32_t *size_local;
  uint32_t *off_local;
  
  mixed_err(0);
  local_58 = *size;
  local_54 = buffer->read;
  uVar1 = buffer->write & 0x7fffffff;
  if ((int)buffer->write < 0) {
    if (local_54 <= uVar1) {
      *size = 0;
      *off = 0;
      return 0;
    }
    if (local_54 - uVar1 <= local_58) {
      local_58 = local_54 - uVar1;
    }
    *size = local_58;
    *off = uVar1;
    buffer->reserved = local_58;
  }
  else {
    local_50 = buffer->size - uVar1;
    if (local_50 == 0) {
      if (local_54 == 0) {
        *size = 0;
        *off = 0;
        return 0;
      }
      if (local_58 < local_54) {
        local_54 = local_58;
      }
      *size = local_54;
      *off = 0;
      buffer->reserved = local_54;
      LOCK();
      buffer->write = 0x80000000;
      UNLOCK();
    }
    else {
      if (local_58 < local_50) {
        local_50 = local_58;
      }
      *size = local_50;
      *off = uVar1;
      buffer->reserved = local_50;
    }
  }
  return 1;
}

Assistant:

static inline int bip_request_write(uint32_t *off, uint32_t *size, struct bip *buffer){
  mixed_err(MIXED_NO_ERROR);
  uint32_t to_write = *size;
  read_buffer_state(read, write, full_r2, buffer);
  // Check if we're waiting for read to catch up with a full second region
  if(!full_r2){
    uint32_t available = buffer->size - write;
    if(0 < available){ // No, we still have space left.
      to_write = MIN(to_write, available);
      *size = to_write;
      *off = write;
      buffer->reserved = to_write;
    }else if(0 < read){ // We are at the end and need to wrap now.
      to_write = MIN(to_write, read);
      *size = to_write;
      *off = 0;
      buffer->reserved = to_write;
      atomic_write(buffer->write, 0x80000000);
    }else{ // Read has not done anything yet, no space!
      *size = 0;
      *off = 0;
      debug_log("%p Overrun", (void*)buffer);
      return 0;
    }
  }else if(write < read){
    // We're behind read, but still have some space.
    to_write = MIN(to_write, read-write);
    *size = to_write;
    *off = write;
    buffer->reserved = to_write;
  }else{
    *size = 0;
    *off = 0;
    debug_log("%p Overrun", (void*)buffer);
    return 0;
  }
  return 1;
}